

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLElement * __thiscall tinyxml2::XMLNode::PreviousSiblingElement(XMLNode *this,char *name)

{
  XMLNode *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  long lVar5;
  char cVar6;
  XMLElement *pXVar3;
  
  pXVar1 = this->_prev;
  do {
    if (pXVar1 == (XMLNode *)0x0) {
      return (XMLElement *)0x0;
    }
    iVar2 = (*pXVar1->_vptr_XMLNode[6])(pXVar1);
    pXVar3 = (XMLElement *)CONCAT44(extraout_var,iVar2);
    if (pXVar3 != (XMLElement *)0x0) {
      if (name == (char *)0x0) {
        return pXVar3;
      }
      iVar2 = (*(pXVar3->super_XMLNode)._vptr_XMLNode[9])(pXVar3);
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        pcVar4 = StrPair::GetStr(&(pXVar3->super_XMLNode)._value);
        if (pcVar4 == name) {
          return pXVar3;
        }
      }
      else {
        pcVar4 = (char *)0x0;
      }
      cVar6 = *name;
      if (cVar6 != '\0') {
        lVar5 = 0;
        do {
          if ((cVar6 != pcVar4[lVar5]) || ((int)lVar5 == 0x7fffffff)) {
            if ((int)lVar5 == 0x7fffffff) {
              return pXVar3;
            }
            goto LAB_001a45c8;
          }
          cVar6 = name[lVar5 + 1];
          lVar5 = lVar5 + 1;
        } while (cVar6 != '\0');
        if ((int)lVar5 == 0x7fffffff) {
          return pXVar3;
        }
        pcVar4 = pcVar4 + lVar5;
      }
      if (*pcVar4 == '\0') {
        return pXVar3;
      }
    }
LAB_001a45c8:
    pXVar1 = pXVar1->_prev;
  } while( true );
}

Assistant:

const XMLElement* XMLNode::PreviousSiblingElement( const char* name ) const
{
    for( const XMLNode* node = _prev; node; node = node->_prev ) {
        const XMLElement* element = node->ToElement();
        if ( element
                && (!name || XMLUtil::StringEqual( name, element->Name() ))) {
            return element;
        }
    }
    return 0;
}